

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

DBInfo __thiscall Clasp::Solver::reduceLinear(Solver *this,uint32 maxR,CmpScore *sc)

{
  CmpScore *pCVar1;
  DBInfo DVar2;
  bool bVar3;
  size_type sVar4;
  uint32 uVar5;
  uint32 uVar6;
  size_type sVar7;
  uint uVar8;
  reference ppCVar9;
  int in_ESI;
  long in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool isGlue;
  bool isLocked;
  ScoreType a;
  Constraint *c;
  size_type i_1;
  double scoreMax;
  double scoreThresh;
  double avgAct;
  size_type i;
  uint64 scoreSum;
  DBInfo res;
  undefined4 in_stack_ffffffffffffff38;
  uint32 in_stack_ffffffffffffff3c;
  CmpScore *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  byte bVar13;
  CmpScore *in_stack_ffffffffffffff50;
  size_type local_58;
  double local_48;
  size_type local_34;
  long local_30;
  int local_1c;
  size_type local_c;
  int iStack_8;
  uint32 local_4;
  undefined4 uVar12;
  
  local_30 = 0;
  local_34 = 0;
  while( true ) {
    sVar4 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                      ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                       (in_RDI + 0x158));
    if (local_34 == sVar4) break;
    ppCVar9 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
              operator[]((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                         (in_RDI + 0x158),local_34);
    (*(*ppCVar9)->_vptr_Constraint[0xc])();
    uVar5 = CmpScore::score(in_stack_ffffffffffffff40,
                            (ConstraintScore *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_30 = (ulong)uVar5 + local_30;
    local_34 = local_34 + 1;
  }
  uVar12 = (undefined4)((ulong)local_30 >> 0x20);
  auVar10._8_4_ = uVar12;
  auVar10._0_8_ = local_30;
  auVar10._12_4_ = 0x45300000;
  uVar5 = numLearntConstraints((Solver *)0x1f0232);
  local_48 = (((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0)) / (double)uVar5) *
             1.5;
  makeScore((uint32)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  uVar5 = CmpScore::score(in_stack_ffffffffffffff40,
                          (ConstraintScore *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if ((double)uVar5 < local_48) {
    auVar11._8_4_ = uVar12;
    auVar11._0_8_ = local_30;
    auVar11._12_4_ = 0x45300000;
    in_stack_ffffffffffffff50 =
         (CmpScore *)
         ((auVar11._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0));
    uVar6 = numLearntConstraints((Solver *)0x1f02fe);
    local_48 = ((double)uVar5 + (double)in_stack_ffffffffffffff50 / (double)uVar6) / 2.0;
  }
  memset(&local_c,0,0xc);
  local_58 = 0;
  local_1c = in_ESI;
  do {
    sVar4 = local_58;
    sVar7 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                      ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                       (in_RDI + 0x158));
    if (sVar4 == sVar7) {
      DVar2.locked = iStack_8;
      DVar2.size = local_c;
      DVar2.pinned = local_4;
      return DVar2;
    }
    ppCVar9 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
              operator[]((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                         (in_RDI + 0x158),local_58);
    pCVar1 = (CmpScore *)*ppCVar9;
    (*(code *)pCVar1->db[6].ebo_.buf)();
    uVar8 = (**(code **)&pCVar1->db[5].ebo_.size)(pCVar1,in_RDI);
    uVar5 = CmpScore::score(in_stack_ffffffffffffff40,
                            (ConstraintScore *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    in_stack_ffffffffffffff48 = CONCAT13(1,(int3)in_stack_ffffffffffffff48);
    if ((double)uVar5 <= local_48) {
      bVar3 = CmpScore::isGlue(in_stack_ffffffffffffff40,
                               (ConstraintScore *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      in_stack_ffffffffffffff48 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff48);
    }
    bVar13 = (byte)((uint)in_stack_ffffffffffffff48 >> 0x18);
    if (((local_1c == 0) || ((uVar8 & 1) != 0)) || (bVar13 != 0)) {
LAB_001f0431:
      sVar4 = local_c;
      local_4 = bVar13 + local_4;
      iStack_8 = (uint)((byte)uVar8 & 1) + iStack_8;
      local_c = local_c + 1;
      in_stack_ffffffffffffff40 = pCVar1;
      ppCVar9 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                operator[]((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                           (in_RDI + 0x158),sVar4);
      *ppCVar9 = (Constraint *)in_stack_ffffffffffffff40;
      (**(code **)&pCVar1->db[6].ebo_.size)();
    }
    else {
      bVar3 = CmpScore::isFrozen(in_stack_ffffffffffffff50,
                                 (ConstraintScore *)CONCAT44(sVar4,in_stack_ffffffffffffff48));
      if (bVar3) goto LAB_001f0431;
      local_1c = local_1c + -1;
      (**(code **)&pCVar1->db[2].ebo_.size)(pCVar1,in_RDI,1);
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

Solver::DBInfo Solver::reduceLinear(uint32 maxR, const CmpScore& sc) {
	// compute average activity
	uint64 scoreSum = 0;
	for (LitVec::size_type i = 0; i != learnts_.size(); ++i) {
		scoreSum += sc.score(learnts_[i]->activity());
	}
	double avgAct = (scoreSum / (double) numLearntConstraints());
	// constraints with score > 1.5 times the average are "active"
	double scoreThresh = avgAct * 1.5;
	double scoreMax    = (double)sc.score(makeScore(Clasp::ACT_MAX, 1));
	if (scoreThresh > scoreMax) {
		scoreThresh = (scoreMax + (scoreSum / (double) numLearntConstraints())) / 2.0;
	}
	// remove up to maxR constraints but keep "active" and locked once
	DBInfo res = {0,0,0};
	typedef ConstraintScore ScoreType;
	for (LitVec::size_type i = 0; i != learnts_.size(); ++i) {
		Constraint* c = learnts_[i];
		ScoreType a   = c->activity();
		bool isLocked = c->locked(*this);
		bool isGlue   = sc.score(a) > scoreThresh || sc.isGlue(a);
		if (maxR == 0 || isLocked || isGlue || sc.isFrozen(a)) {
			res.pinned += isGlue;
			res.locked += isLocked;
			learnts_[res.size++] = c;
			c->decreaseActivity();
		}
		else {
			--maxR;
			c->destroy(this, true);
		}
	}
	return res;
}